

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::RunMemoryCheck(SystemInformationImplementation *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  uint uVar7;
  bool bVar8;
  long lVar9;
  ulong *puVar10;
  undefined4 uStack_638;
  undefined2 uStack_634;
  undefined2 uStack_632;
  long lStack_630;
  ulong uStack_628;
  ulong uStack_620;
  ulong uStack_618;
  SystemInformationImplementation *pSStack_610;
  FILE *pFStack_608;
  long lStack_600;
  ulong uStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  long lStack_5e0;
  ulong uStack_5d8;
  ulong uStack_5d0;
  utsname uStack_5be;
  char acStack_438 [1032];
  
  uStack_618 = 0;
  uStack_620 = 0;
  uStack_628 = 0;
  lStack_630 = 0;
  iVar1 = uname(&uStack_5be);
  if (iVar1 == 0) {
    sVar6 = strlen(uStack_5be.release);
    bVar8 = false;
    uVar7 = 0;
    if (2 < sVar6) {
      uVar7 = 0;
      if ((int)uStack_5be.release[0] - 0x30U < 10) {
        uVar7 = (int)uStack_5be.release[0] - 0x30U;
      }
      bVar8 = '5' < uStack_5be.release[2] && (int)uStack_5be.release[2] - 0x30U < 10;
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar7) || ((bool)(uVar7 == 2 & bVar8))) {
        uStack_634 = 0;
        uStack_638 = 0;
        iVar1 = 0;
        pSStack_610 = this;
        pFStack_608 = __stream;
        while (__stream = pFStack_608, pcVar5 = fgets(acStack_438,0x400,pFStack_608),
              pcVar5 != (char *)0x0) {
          puVar10 = &uStack_5f8;
          pcVar5 = (char *)&uStack_638;
          for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
            if ((*pcVar5 == '\0') &&
               (iVar2 = __isoc99_sscanf(acStack_438,
                                        (long)&DAT_005f01d0 +
                                        (long)*(int *)((long)&DAT_005f01d0 + lVar9),puVar10),
               iVar2 == 1)) {
              *pcVar5 = '\x01';
              iVar1 = iVar1 + 1;
            }
            puVar10 = puVar10 + 1;
            pcVar5 = pcVar5 + 1;
          }
        }
        if (iVar1 == 6) {
          pSStack_610->TotalPhysicalMemory = uStack_5f8 >> 10;
          pSStack_610->AvailablePhysicalMemory = (ulong)(lStack_5e8 + lStack_5f0 + lStack_5e0) >> 10
          ;
          pSStack_610->TotalVirtualMemory = uStack_5d8 >> 10;
          pSStack_610->AvailableVirtualMemory = uStack_5d0 >> 10;
LAB_004e4f50:
          fclose(__stream);
          return;
        }
      }
      else {
        pcVar5 = fgets(acStack_438,0x400,__stream);
        if (pcVar5 == acStack_438) {
          iVar1 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&uStack_620,&uStack_5f8,
                                  &lStack_630,&uStack_5f8,&lStack_600,&uStack_638);
          if (iVar1 == 6) {
            iVar1 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&uStack_618,&uStack_5f8,
                                    &uStack_628);
            iVar1 = iVar1 + 6;
          }
          if (iVar1 == 9) {
            this->TotalVirtualMemory = uStack_618 >> 0x14;
            this->TotalPhysicalMemory = uStack_620 >> 0x14;
            this->AvailableVirtualMemory = uStack_628 >> 0x14;
            this->AvailablePhysicalMemory =
                 (ulong)(lStack_600 + lStack_630 +
                        CONCAT26(uStack_632,CONCAT24(uStack_634,uStack_638))) >> 0x14;
            goto LAB_004e4f50;
          }
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Problem parsing /proc/meminfo");
      std::endl<char,std::char_traits<char>>(poVar3);
      fclose(__stream);
      return;
    }
    poVar3 = (ostream *)&std::cout;
    pcVar5 = "Problem opening /proc/meminfo";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Problem calling uname(): ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void SystemInformationImplementation::RunMemoryCheck()
{
#if defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisMemory();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXMemory();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDMemory();
#elif defined(__CYGWIN__)
  this->QueryCygwinMemory();
#elif defined(_WIN32)
  this->QueryWindowsMemory();
#elif defined(__hpux)
  this->QueryHPUXMemory();
#elif defined(__linux)
  this->QueryLinuxMemory();
#elif defined(_AIX)
  this->QueryAIXMemory();
#else
  this->QueryMemory();
#endif
}